

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PrefixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  ExpressionSyntax *syntax_00;
  Type *args_1;
  ulong uVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar3;
  Expression *args_2;
  UnaryExpression *expr;
  Diagnostic *diag;
  SourceLocation SVar4;
  logic_error *this;
  long *plVar5;
  SourceLocation *pSVar6;
  char *func;
  size_type *psVar7;
  long *plVar8;
  SourceRange sourceRange;
  UnaryOperator op;
  bool local_f5;
  UnaryOperator local_f4;
  SourceRange local_f0;
  long local_e0;
  SourceLocation SStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f4 = Expression::getUnaryOperator((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  syntax_00 = (syntax->operand).ptr;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
LAB_003c0cbe:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  args_2 = Expression::create(compilation,syntax_00,context,
                              (bitmask<slang::ast::ASTFlags>)
                              ((ulong)(local_f4 - Preincrement < 4) << 0x16),(Type *)0x0);
  args_1 = (args_2->type).ptr;
  if (args_1 == (Type *)0x0) {
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
    goto LAB_003c0cbe;
  }
  local_f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_f4,args_1,args_2,&local_f0);
  bVar3 = Expression::bad(args_2);
  if (bVar3) goto LAB_003c0c28;
  psVar1 = &(syntax->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_01.data_ = psVar1->data_;
  syntax_01.size_ = psVar1->size_;
  if ((syntax->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  ASTContext::setAttributes(context,&expr->super_Expression,syntax_01);
  switch((syntax->super_ExpressionSyntax).super_SyntaxNode.kind) {
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
    local_f5 = Type::isIntegral(args_1);
    break;
  case UnaryBitwiseNotExpression:
    bVar3 = Type::isIntegral(args_1);
    goto LAB_003c0be6;
  case UnaryLogicalNotExpression:
    local_f5 = Type::isNumeric(args_1);
    break;
  case UnaryMinusExpression:
  case UnaryPlusExpression:
    bVar3 = Type::isNumeric(args_1);
LAB_003c0be6:
    (expr->super_Expression).type.ptr = args_1;
    if (bVar3 != false) {
      return &expr->super_Expression;
    }
    goto LAB_003c0bee;
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
    uVar2 = (context->flags).m_bits;
    if (((uint)uVar2 & 0xa0) != 0x80 && (uVar2 & 0x40) == 0) {
      local_f5 = Type::isNumeric(args_1);
      (expr->super_Expression).type.ptr = args_1;
      SVar4 = parsing::Token::location(&syntax->operatorToken);
      bVar3 = Expression::requireLValue
                        (args_2,context,SVar4,(bitmask<slang::ast::AssignFlags>)0x0,
                         (Expression *)0x0,(EvalContext *)0x0);
      if (!bVar3) goto LAB_003c0c28;
      goto LAB_003c0b89;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x500007,sourceRange);
    goto LAB_003c0c28;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,"");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x173);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar5;
    plVar8 = plVar5 + 2;
    if (local_90 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pSVar6 = (SourceLocation *)std::__cxx11::string::append((char *)&local_90);
    local_f0.startLoc = *pSVar6;
    SVar4 = (SourceLocation)(pSVar6 + 2);
    if (local_f0.startLoc == SVar4) {
      local_e0 = *(long *)SVar4;
      SStack_d8 = pSVar6[3];
      local_f0.startLoc = (SourceLocation)&local_e0;
    }
    else {
      local_e0 = *(long *)SVar4;
    }
    local_f0.endLoc = pSVar6[1];
    *pSVar6 = SVar4;
    pSVar6[1] = (SourceLocation)0x0;
    *(undefined1 *)(pSVar6 + 2) = 0;
    std::logic_error::logic_error(this,(string *)&local_f0);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar3 = Type::isFourState(args_1);
  if (compilation->scalarTypeTable[(ulong)bVar3 + 8] == (Type *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x1b,
               "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
              );
  }
  (expr->super_Expression).type.ptr = compilation->scalarTypeTable[(ulong)bVar3 + 8];
  Expression::selfDetermined(context,&expr->operand_);
LAB_003c0b89:
  if (local_f5 == false) {
LAB_003c0bee:
    SVar4 = parsing::Token::location(&syntax->operatorToken);
    diag = ASTContext::addDiag(context,(DiagCode)0x310007,SVar4);
    ast::operator<<(diag,args_1);
    Diagnostic::operator<<(diag,args_2->sourceRange);
LAB_003c0c28:
    expr = (UnaryExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PrefixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    auto op = getUnaryOperator(syntax.kind);
    bitmask<ASTFlags> extraFlags;
    if (isLValueOp(op))
        extraFlags = ASTFlags::LValue;

    Expression& operand = create(compilation, *syntax.operand, context, extraFlags);
    const Type* type = operand.type;

    auto result = compilation.emplace<UnaryExpression>(op, *type, operand, syntax.sourceRange());
    if (operand.bad())
        return badExpr(compilation, result);

    context.setAttributes(*result, syntax.attributes);

    bool good;
    switch (syntax.kind) {
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
            // Supported for both integral and real types. Result is same as input type.
            good = type->isNumeric();
            result->type = type;
            break;
        case SyntaxKind::UnaryLogicalNotExpression:
            // Supported for both integral and real types. Result is a single bit.
            good = type->isNumeric();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryBitwiseNotExpression:
            // Supported for integral only. Result is same as input type.
            good = type->isIntegral();
            result->type = type;
            break;
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
            // Supported for integral only. Result type is always a single bit.
            good = type->isIntegral();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            if ((context.flags.has(ASTFlags::NonProcedural) &&
                 !context.flags.has(ASTFlags::AssignmentAllowed)) ||
                context.flags.has(ASTFlags::AssignmentDisallowed)) {
                context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
                return badExpr(compilation, result);
            }

            // Supported for both integral and real types. Result is same as input type.
            // The operand must also be an assignable lvalue.
            // TODO: detect and warn for multiple reads and writes of a single variable in an
            // expression
            good = type->isNumeric();
            result->type = type;
            if (!operand.requireLValue(context, syntax.operatorToken.location())) {
                return badExpr(compilation, result);
            }

            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}